

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O2

void __thiscall NutFunction::GenerateBodySource(NutFunction *this,int n,ostream *out)

{
  pointer pIVar1;
  ostream *poVar2;
  LocalVariableExpression *this_00;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar3;
  int *piVar4;
  pointer pLVar5;
  pointer pLVar6;
  char *pcVar7;
  pointer pLVar8;
  size_t i;
  pointer obj;
  pointer pOVar9;
  ulong uVar10;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_a8;
  VMState state;
  
  if (this->m_IsGenerator == true) {
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    poVar2 = std::operator<<(poVar2,"// Function is a generator.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if (g_DebugMode == true) {
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    poVar2 = std::operator<<(poVar2,"// Defaults:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (piVar4 = (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar4 != (this->m_DefaultParams).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar4 = piVar4 + 1) {
      state.m_Parent._0_4_ = n;
      poVar2 = operator<<(out,(indent *)&state);
      poVar2 = std::operator<<(poVar2,"//\t");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::endl<char,std::char_traits<char>>(out);
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    poVar2 = std::operator<<(poVar2,"// Literals:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (obj = (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>._M_impl.
               super__Vector_impl_data._M_start;
        obj != (this->m_Literals).super__Vector_base<SqObject,_std::allocator<SqObject>_>._M_impl.
               super__Vector_impl_data._M_finish; obj = obj + 1) {
      state.m_Parent._0_4_ = n;
      poVar2 = operator<<(out,(indent *)&state);
      poVar2 = std::operator<<(poVar2,"//\t");
      poVar2 = operator<<(poVar2,obj);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::endl<char,std::char_traits<char>>(out);
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    poVar2 = std::operator<<(poVar2,"// Outer values:");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (pOVar9 = (this->m_OuterValues).
                  super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pOVar9 != (this->m_OuterValues).
                  super__Vector_base<NutFunction::OuterValueInfo,_std::allocator<NutFunction::OuterValueInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pOVar9 = pOVar9 + 1) {
      state.m_Parent._0_4_ = n;
      poVar2 = operator<<(out,(indent *)&state);
      poVar2 = std::operator<<(poVar2,"//\t");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pOVar9->type);
      poVar2 = std::operator<<(poVar2,"  src=");
      poVar2 = operator<<(poVar2,&pOVar9->src);
      poVar2 = std::operator<<(poVar2,"  name=");
      poVar2 = operator<<(poVar2,&pOVar9->name);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::endl<char,std::char_traits<char>>(out);
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    poVar2 = std::operator<<(poVar2,"// Local identifiers:");
    std::endl<char,std::char_traits<char>>(poVar2);
    pLVar8 = (this->m_Locals).
             super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (pLVar8 != (this->m_Locals).
                     super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
      state.m_Parent._0_4_ = n;
      poVar2 = operator<<(out,(indent *)&state);
      poVar2 = std::operator<<(poVar2,"//   -");
      poVar2 = std::operator<<(poVar2,(string *)(pLVar8 + -1));
      local_a8._M_ptr._0_4_ = 10 - (int)pLVar8[-1].name._M_string_length;
      poVar2 = operator<<(poVar2,(spaces *)&local_a8);
      poVar2 = std::operator<<(poVar2," // pos=");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2,"  start=");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2,"  end=");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      pcVar7 = "";
      if (pLVar8[-1].foreachLoopState != false) {
        pcVar7 = " foreach state";
      }
      poVar2 = std::operator<<(poVar2,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar2);
      pLVar8 = pLVar8 + -1;
    }
    std::endl<char,std::char_traits<char>>(out);
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    poVar2 = std::operator<<(poVar2,"// Instructions:");
    std::endl<char,std::char_traits<char>>(poVar2);
    pLVar5 = (this->m_LineInfos).
             super__Vector_base<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar10 = 0;
        uVar10 < (ulong)((long)(this->m_Instructions).
                               super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_Instructions).
                               super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1)
    {
      while ((pLVar5 != (this->m_LineInfos).
                        super__Vector_base<NutFunction::LineInfo,_std::allocator<NutFunction::LineInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish && ((uint)pLVar5->op <= uVar10)))
      {
        pLVar5 = pLVar5 + 1;
      }
      state.m_Parent._0_4_ = n;
      poVar2 = operator<<(out,(indent *)&state);
      poVar2 = std::operator<<(poVar2,"// ");
      poVar2 = std::operator<<(poVar2,0x20);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 5;
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::operator<<(poVar2,"  ");
      PrintOpcode(this,out,(int)uVar10,
                  (this->m_Instructions).
                  super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar10);
      std::endl<char,std::char_traits<char>>(out);
    }
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    std::endl<char,std::char_traits<char>>(poVar2);
    state.m_Parent._0_4_ = n;
    poVar2 = operator<<(out,(indent *)&state);
    poVar2 = std::operator<<(poVar2,"// Decompilation attempt:");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  VMState::VMState(&state,this,this->m_StackSize);
  pLVar8 = (this->m_Locals).
           super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (pLVar6 = pLVar8,
        pLVar6 != (this->m_Locals).
                  super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
    pLVar8 = pLVar6 + -1;
    if ((pLVar6[-1].start_op == 0) && (pLVar6[-1].foreachLoopState == false)) {
      this_00 = (LocalVariableExpression *)operator_new(0x28);
      LocalVariableExpression::LocalVariableExpression(this_00,&pLVar8->name);
      std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<LocalVariableExpression,void>
                ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)&local_a8,this_00);
      this_01 = &VMState::AtStack(&state,pLVar6[-1].pos)->
                 super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    }
  }
  while (lVar3 = (long)state.m_IP,
        state.m_IP <
        (int)((ulong)(*(long *)(CONCAT44(state.m_Parent._4_4_,(int)state.m_Parent) + 0xf0) -
                     *(long *)(CONCAT44(state.m_Parent._4_4_,(int)state.m_Parent) + 0xe8)) >> 3)) {
    pIVar1 = (this->m_Instructions).
             super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((pIVar1[lVar3].op == '\x13') &&
        (((long)(this->m_Instructions).
                super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 3) + -1 == lVar3)) &&
       (pIVar1[lVar3].arg0 == -1)) {
      VMState::NextInstruction(&state);
    }
    else {
      DecompileStatement(this,&state);
    }
  }
  VMState::PrintOutput(&state,out,n);
  VMState::~VMState(&state);
  return;
}

Assistant:

void NutFunction::GenerateBodySource( int n, std::ostream& out ) const
{
	//for( auto i = m_Functions.begin(); i != m_Functions.end(); ++i)
	//	i->GenerateFunctionSource(n, out, extraInfo);

	if (m_IsGenerator)
		out << indent(n) << "// Function is a generator." << std::endl;

	if (g_DebugMode)
	{
		out << indent(n) << "// Defaults:" << std::endl;
		for( std::vector<int>::const_iterator i = m_DefaultParams.begin(); i != m_DefaultParams.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;
		
		out << std::endl;

		out << indent(n) << "// Literals:" << std::endl;
		for( std::vector<SqObject>::const_iterator i = m_Literals.begin(); i != m_Literals.end(); ++i)
			out << indent(n) << "//\t" << *i << std::endl;

		out << std::endl;

		out << indent(n) << "// Outer values:" << std::endl;
		for( vector<OuterValueInfo>::const_iterator i = m_OuterValues.begin(); i != m_OuterValues.end(); ++i)
			out << indent(n) << "//\t" << i->type << "  src=" << i->src << "  name=" << i->name << std::endl; 

		out << std::endl;

		out << indent(n) << "// Local identifiers:" << std::endl;
		for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)
		{
			out << indent(n) << "//   -" << i->name << spaces(10 - i->name.size()) 
				<< " // pos=" << i->pos << "  start=" << i->start_op << "  end=" << i->end_op << (i->foreachLoopState ? " foreach state" : "") << std::endl;
		}

		out << std::endl;
		out << indent(n) << "// Instructions:" << std::endl;

		int64_t currentLine = 0;
		vector<LineInfo>::const_iterator lineInfo = m_LineInfos.begin();

		for(size_t i = 0; i < m_Instructions.size(); ++i)
		{
			while (lineInfo != m_LineInfos.end() && i >= (unsigned int)lineInfo->op)
			{
				currentLine = lineInfo->line;
				++lineInfo;
			}

			out << indent(n) << "// " << std::setfill(' ') << std::setw(5) << currentLine << "  ";
			PrintOpcode(out, (int)i, m_Instructions[i]);
			out << std::endl;
		}

		out << indent(n) << std::endl;
		out << indent(n) << "// Decompilation attempt:" << std::endl;
	}

	// Crate new state for decompiler virtual machine
	VMState state(*this, m_StackSize);

	// Set initial stack elements to local identifiers
	for(vector<NutFunction::LocalVarInfo>::const_reverse_iterator i = m_Locals.rbegin(); i != m_Locals.rend(); ++i)	
		if (i->start_op == 0 && !i->foreachLoopState)
			state.AtStack(i->pos) = ExpressionPtr(new LocalVariableExpression(i->name));

	// Decompiler loop
	while(!state.EndOfInstructions())
	{
		if (m_Instructions[state.IP()].op == OP_RETURN && (state.IP() == m_Instructions.size() - 1) && m_Instructions[state.IP()].arg0 == -1)
		{
			// This is last return statement in function - can be skipped
			state.NextInstruction();
			continue;	
		}

		DecompileStatement(state);
	}

	// Print decompiled code
	state.PrintOutput(out, n);
}